

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O1

void __thiscall
S2MinDistanceCellUnionTarget::~S2MinDistanceCellUnionTarget(S2MinDistanceCellUnionTarget *this)

{
  pointer pRVar1;
  pointer pCVar2;
  pointer pSVar3;
  
  (this->super_S2MinDistanceTarget)._vptr_S2DistanceTarget =
       (_func_int **)&PTR__S2MinDistanceCellUnionTarget_002c28f0;
  std::unique_ptr<S2ClosestCellQuery,_std::default_delete<S2ClosestCellQuery>_>::~unique_ptr
            (&this->query_);
  pRVar1 = (this->index_).range_nodes_.
           super__Vector_base<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pRVar1 != (pointer)0x0) {
    operator_delete(pRVar1);
  }
  pCVar2 = (this->index_).cell_tree_.
           super__Vector_base<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pCVar2 != (pointer)0x0) {
    operator_delete(pCVar2);
  }
  pSVar3 = (this->cell_union_).cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pSVar3 != (pointer)0x0) {
    operator_delete(pSVar3);
    return;
  }
  return;
}

Assistant:

S2MinDistanceCellUnionTarget::~S2MinDistanceCellUnionTarget() {
}